

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_command.cpp
# Opt level: O0

void __thiscall Command::invoke(Command *this)

{
  BankAccount *pBVar1;
  Command *this_local;
  
  if (this->action == Deposit) {
    pBVar1 = std::reference_wrapper<BankAccount>::get(&this->bank_account);
    BankAccount::deposit(pBVar1,this->amount);
  }
  else if (this->action == Withdraw) {
    pBVar1 = std::reference_wrapper<BankAccount>::get(&this->bank_account);
    BankAccount::withdraw(pBVar1,this->amount);
  }
  return;
}

Assistant:

void invoke() const override
	{
		switch(action)
		{
		case Action::Deposit:
			bank_account.get().deposit(amount);
			break;
		case Action::Withdraw:
			bank_account.get().withdraw(amount);
			break;
		default:
			break;
		};
	}